

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VarintLen(u64 v)

{
  bool local_d;
  int i;
  u64 v_local;
  
  i = 0;
  v_local = v;
  do {
    i = i + 1;
    v_local = v_local >> 7;
    local_d = v_local != 0 && i < 9;
  } while (local_d);
  return i;
}

Assistant:

SQLITE_PRIVATE int sqlite3VarintLen(u64 v){
  int i = 0;
  do{
    i++;
    v >>= 7;
  }while( v!=0 && ALWAYS(i<9) );
  return i;
}